

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O0

bool __thiscall draco::PointCloudEncoder::RearrangeAttributesEncoders(PointCloudEncoder *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  ulong uVar6;
  size_type sVar7;
  int iVar5;
  pointer pAVar8;
  reference pvVar9;
  uint *puVar10;
  long in_RDI;
  reference rVar11;
  reference rVar12;
  reference rVar13;
  int32_t parent_att_id_1;
  int p_1;
  bool can_be_processed_1;
  int32_t att_id_1;
  int i_1;
  bool attribute_processed;
  int32_t num_encoder_attributes;
  int ae;
  uint32_t ae_order;
  int num_processed_attributes;
  vector<bool,_std::allocator<bool>_> is_attribute_processed;
  vector<int,_std::allocator<int>_> attribute_encoding_order;
  int32_t parent_encoder_id;
  uint32_t parent_att_id;
  int ap;
  int32_t att_id;
  uint32_t p;
  bool can_be_processed;
  uint32_t i;
  bool encoder_processed;
  uint32_t num_processed_encoders;
  vector<bool,_std::allocator<bool>_> is_encoder_processed;
  int in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  allocator_type *in_stack_fffffffffffffdb8;
  bool *in_stack_fffffffffffffdc0;
  size_type in_stack_fffffffffffffdc8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffdd0;
  byte local_1a9;
  reference local_148;
  reference local_138;
  int local_124;
  uint local_120;
  byte local_119;
  reference local_118;
  uint local_108;
  int local_104;
  byte local_fd;
  uint32_t local_fc;
  int local_f8;
  uint local_f4;
  int local_f0;
  undefined1 local_e9;
  vector<int,_std::allocator<int>_> local_c0;
  undefined4 local_a4;
  reference local_a0;
  reference local_90;
  value_type local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  byte local_69;
  reference local_68;
  uint local_58;
  byte local_51;
  uint local_50;
  undefined1 local_39;
  byte local_1;
  
  std::
  vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
  ::size((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
          *)(in_RDI + 0x10));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  std::
  vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
  ::size((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
          *)(in_RDI + 0x10));
  local_39 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x1af7c1);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1af7f5);
  local_50 = 0;
  do {
    do {
      uVar6 = (ulong)local_50;
      sVar7 = std::
              vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
              ::size((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                      *)(in_RDI + 0x10));
      if (sVar7 <= uVar6) {
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x1afc8d);
        PointCloud::num_attributes((PointCloud *)0x1afc9e);
        local_e9 = 0;
        std::allocator<bool>::allocator((allocator<bool> *)0x1afcc9);
        std::vector<bool,_std::allocator<bool>_>::vector
                  (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                   in_stack_fffffffffffffdb8);
        std::allocator<bool>::~allocator((allocator<bool> *)0x1afcf7);
        rVar11._M_mask = in_stack_fffffffffffffdc8;
        rVar11._M_p = (_Bit_type *)in_stack_fffffffffffffdd0;
        rVar13._M_mask = (_Bit_type)in_stack_fffffffffffffdb8;
        rVar13._M_p = (_Bit_type *)in_stack_fffffffffffffdc0;
        local_f4 = 0;
        while( true ) {
          uVar6 = (ulong)local_f4;
          sVar7 = std::
                  vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                  ::size((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                          *)(in_RDI + 0x10));
          if (sVar7 <= uVar6) break;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(ulong)local_f4);
          local_f8 = *pvVar9;
          std::
          vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
          ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                        *)(in_RDI + 0x10),(long)local_f8);
          std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
          ::operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                        *)0x1afd74);
          local_fc = AttributesEncoder::num_attributes((AttributesEncoder *)0x1afd7c);
          if (1 < (int)local_fc) {
            local_f0 = 0;
            std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)rVar11._M_p,rVar11._M_mask);
            while (local_f0 < (int)local_fc) {
              local_fd = 0;
              for (local_104 = 0; local_104 < (int)local_fc; local_104 = local_104 + 1) {
                std::
                vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                              *)(in_RDI + 0x10),(long)local_f8);
                std::
                unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                ::operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                              *)0x1afe81);
                local_108 = AttributesEncoder::GetAttributeId
                                      ((AttributesEncoder *)
                                       CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
                                       ,in_stack_fffffffffffffdac);
                rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   ((vector<bool,_std::allocator<bool>_> *)rVar11._M_p,
                                    rVar11._M_mask);
                local_118 = rVar12;
                bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_118);
                if (!bVar3) {
                  local_119 = 1;
                  local_120 = 0;
                  while( true ) {
                    uVar1 = local_120;
                    std::
                    vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                    ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                                  *)(in_RDI + 0x10),(long)local_f8);
                    pAVar8 = std::
                             unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                             ::operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                                           *)0x1aff33);
                    iVar5 = (*pAVar8->_vptr_AttributesEncoder[6])(pAVar8,(ulong)local_108);
                    if (iVar5 <= (int)uVar1) break;
                    std::
                    vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                    ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                                  *)(in_RDI + 0x10),(long)local_f8);
                    pAVar8 = std::
                             unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                             ::operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                                           *)0x1aff7d);
                    local_124 = (*pAVar8->_vptr_AttributesEncoder[7])
                                          (pAVar8,(ulong)local_108,(ulong)local_120);
                    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                       ((vector<bool,_std::allocator<bool>_> *)rVar11._M_p,
                                        rVar11._M_mask);
                    local_138 = rVar11;
                    bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_138);
                    if (((bVar3 ^ 0xffU) & 1) != 0) {
                      local_119 = 0;
                      break;
                    }
                    local_120 = local_120 + 1;
                  }
                  if ((local_119 & 1) != 0) {
                    sVar7 = (size_type)local_f0;
                    local_f0 = local_f0 + 1;
                    in_stack_fffffffffffffdb4 = local_104;
                    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_c0,sVar7);
                    *pvVar9 = in_stack_fffffffffffffdb4;
                    rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                       ((vector<bool,_std::allocator<bool>_> *)rVar11._M_p,
                                        rVar11._M_mask);
                    local_148 = rVar13;
                    std::_Bit_reference::operator=(&local_148,true);
                    local_fd = 1;
                  }
                }
              }
              if (((local_fd & 1) == 0) && (local_f0 < (int)local_fc)) {
                local_1 = 0;
                goto LAB_001b0157;
              }
            }
            std::
            vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
            ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                          *)(in_RDI + 0x10),(long)local_f8);
            std::
            unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>::
            operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                        *)0x1b011a);
            AttributesEncoder::SetAttributeIds
                      ((AttributesEncoder *)rVar11._M_p,
                       (vector<int,_std::allocator<int>_> *)rVar11._M_mask);
          }
          local_f4 = local_f4 + 1;
        }
        local_1 = 1;
LAB_001b0157:
        local_a4 = 1;
        std::vector<bool,_std::allocator<bool>_>::~vector
                  ((vector<bool,_std::allocator<bool>_> *)0x1b0164);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)rVar13._M_p);
        goto LAB_001b0182;
      }
      local_51 = 0;
      local_58 = 0;
      while( true ) {
        uVar6 = (ulong)local_58;
        sVar7 = std::
                vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                ::size((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                        *)(in_RDI + 0x10));
        if (sVar7 <= uVar6) break;
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        local_68 = rVar11;
        bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_68);
        if (!bVar3) {
          local_69 = 1;
          local_70 = 0;
          while( true ) {
            uVar1 = local_70;
            std::
            vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
            ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                          *)(in_RDI + 0x10),(ulong)local_58);
            std::
            unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>::
            operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                        *)0x1af95d);
            uVar4 = AttributesEncoder::num_attributes((AttributesEncoder *)0x1af965);
            uVar2 = local_58;
            if (uVar4 <= uVar1) break;
            std::
            vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
            ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                          *)(in_RDI + 0x10),(ulong)local_58);
            std::
            unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>::
            operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                        *)0x1af9a6);
            local_74 = AttributesEncoder::GetAttributeId
                                 ((AttributesEncoder *)
                                  CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                                  in_stack_fffffffffffffdac);
            local_78 = 0;
            while( true ) {
              uVar1 = local_78;
              std::
              vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
              ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                            *)(in_RDI + 0x10),(ulong)local_58);
              pAVar8 = std::
                       unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                       ::operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                                     *)0x1afa07);
              iVar5 = (*pAVar8->_vptr_AttributesEncoder[6])(pAVar8,(ulong)local_74);
              if (iVar5 <= (int)uVar1) break;
              std::
              vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
              ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                            *)(in_RDI + 0x10),(ulong)local_58);
              pAVar8 = std::
                       unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                       ::operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                                     *)0x1afa5b);
              local_7c = (*pAVar8->_vptr_AttributesEncoder[7])
                                   (pAVar8,(ulong)local_74,(ulong)local_78);
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),
                                  (ulong)local_7c);
              local_80 = *pvVar9;
              local_1a9 = 0;
              if (local_7c != local_58) {
                rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
                local_90 = rVar11;
                bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_90);
                local_1a9 = bVar3 ^ 0xff;
              }
              if ((local_1a9 & 1) != 0) {
                local_69 = 0;
                break;
              }
              local_78 = local_78 + 1;
            }
            local_70 = local_70 + 1;
          }
          if ((local_69 & 1) != 0) {
            uVar6 = (ulong)local_50;
            local_50 = local_50 + 1;
            puVar10 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),uVar6)
            ;
            *puVar10 = uVar2;
            rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
            local_a0 = rVar11;
            std::_Bit_reference::operator=(&local_a0,true);
            local_51 = 1;
          }
        }
        local_58 = local_58 + 1;
      }
    } while ((local_51 & 1) != 0);
    uVar6 = (ulong)local_50;
    sVar7 = std::
            vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
            ::size((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                    *)(in_RDI + 0x10));
  } while (sVar7 <= uVar6);
  local_1 = 0;
  local_a4 = 1;
LAB_001b0182:
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x1b018f)
  ;
  return (bool)(local_1 & 1);
}

Assistant:

bool PointCloudEncoder::RearrangeAttributesEncoders() {
  // Find the encoding order of the attribute encoders that is determined by
  // the parent dependencies between individual encoders. Instead of traversing
  // a graph we encode the attributes in multiple iterations where encoding of
  // attributes that depend on other attributes may get postponed until the
  // parent attributes are processed.
  // This is simpler to implement than graph traversal and it automatically
  // detects any cycles in the dependency graph.
  // TODO(ostava): Current implementation needs to encode all attributes of a
  // single encoder to be encoded in a single "chunk", therefore we need to sort
  // attribute encoders before we sort individual attributes. This requirement
  // can be lifted for encoders that can encode individual attributes separately
  // but it will require changes in the current API.
  attributes_encoder_ids_order_.resize(attributes_encoders_.size());
  std::vector<bool> is_encoder_processed(attributes_encoders_.size(), false);
  uint32_t num_processed_encoders = 0;
  while (num_processed_encoders < attributes_encoders_.size()) {
    // Flagged when any of the encoder get processed.
    bool encoder_processed = false;
    for (uint32_t i = 0; i < attributes_encoders_.size(); ++i) {
      if (is_encoder_processed[i]) {
        continue;  // Encoder already processed.
      }
      // Check if all parent encoders are already processed.
      bool can_be_processed = true;
      for (uint32_t p = 0; p < attributes_encoders_[i]->num_attributes(); ++p) {
        const int32_t att_id = attributes_encoders_[i]->GetAttributeId(p);
        for (int ap = 0;
             ap < attributes_encoders_[i]->NumParentAttributes(att_id); ++ap) {
          const uint32_t parent_att_id =
              attributes_encoders_[i]->GetParentAttributeId(att_id, ap);
          const int32_t parent_encoder_id =
              attribute_to_encoder_map_[parent_att_id];
          if (parent_att_id != i && !is_encoder_processed[parent_encoder_id]) {
            can_be_processed = false;
            break;
          }
        }
      }
      if (!can_be_processed) {
        continue;  // Try to process the encoder in the next iteration.
      }
      // Encoder can be processed. Update the encoding order.
      attributes_encoder_ids_order_[num_processed_encoders++] = i;
      is_encoder_processed[i] = true;
      encoder_processed = true;
    }
    if (!encoder_processed &&
        num_processed_encoders < attributes_encoders_.size()) {
      // No encoder was processed but there are still some remaining unprocessed
      // encoders.
      return false;
    }
  }

  // Now for every encoder, reorder the attributes to satisfy their
  // dependencies (an attribute may still depend on other attributes within an
  // encoder).
  std::vector<int32_t> attribute_encoding_order;
  std::vector<bool> is_attribute_processed(point_cloud_->num_attributes(),
                                           false);
  int num_processed_attributes;
  for (uint32_t ae_order = 0; ae_order < attributes_encoders_.size();
       ++ae_order) {
    const int ae = attributes_encoder_ids_order_[ae_order];
    const int32_t num_encoder_attributes =
        attributes_encoders_[ae]->num_attributes();
    if (num_encoder_attributes < 2) {
      continue;  // No need to resolve dependencies for a single attribute.
    }
    num_processed_attributes = 0;
    attribute_encoding_order.resize(num_encoder_attributes);
    while (num_processed_attributes < num_encoder_attributes) {
      // Flagged when any of the attributes get processed.
      bool attribute_processed = false;
      for (int i = 0; i < num_encoder_attributes; ++i) {
        const int32_t att_id = attributes_encoders_[ae]->GetAttributeId(i);
        if (is_attribute_processed[i]) {
          continue;  // Attribute already processed.
        }
        // Check if all parent attributes are already processed.
        bool can_be_processed = true;
        for (int p = 0;
             p < attributes_encoders_[ae]->NumParentAttributes(att_id); ++p) {
          const int32_t parent_att_id =
              attributes_encoders_[ae]->GetParentAttributeId(att_id, p);
          if (!is_attribute_processed[parent_att_id]) {
            can_be_processed = false;
            break;
          }
        }
        if (!can_be_processed) {
          continue;  // Try to process the attribute in the next iteration.
        }
        // Attribute can be processed. Update the encoding order.
        attribute_encoding_order[num_processed_attributes++] = i;
        is_attribute_processed[i] = true;
        attribute_processed = true;
      }
      if (!attribute_processed &&
          num_processed_attributes < num_encoder_attributes) {
        // No attribute was processed but there are still some remaining
        // unprocessed attributes.
        return false;
      }
    }
    // Update the order of the attributes within the encoder.
    attributes_encoders_[ae]->SetAttributeIds(attribute_encoding_order);
  }
  return true;
}